

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

void proto2_unittest::TestMessageWithCustomOptions::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  Nullable<const_char_*> failure_msg;
  Arena *arena;
  TestMessageWithCustomOptions *_this;
  TestMessageWithCustomOptions *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (TestMessageWithCustomOptions *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestMessageWithCustomOptions_const*,proto2_unittest::TestMessageWithCustomOptions*>
                          ((TestMessageWithCustomOptions **)local_20,&local_28,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::internal::
    TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom(&(local_28->field_0)._impl_.map_field_.
                 super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,(TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&from_msg[1]._internal_metadata_);
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      uVar3 = from_msg[4]._internal_metadata_.ptr_;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      arena = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.field1_,(string *)(uVar3 & 0xfffffffffffffffc),arena);
    }
    (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    uVar2 = *(uint32_t *)((long)&from_msg[5]._vptr_MessageLite + 4);
    if (uVar2 != 0) {
      if ((local_28->field_0)._impl_._oneof_case_[0] != uVar2) {
        (local_28->field_0)._impl_._oneof_case_[0] = uVar2;
      }
      if (uVar2 == 2) {
        *(undefined4 *)((long)&local_28->field_0 + 0x40) =
             *(undefined4 *)&from_msg[5]._vptr_MessageLite;
      }
    }
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_28->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_custom_options.pb.cc"
             ,0x65f,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

void TestMessageWithCustomOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMessageWithCustomOptions*>(&to_msg);
  auto& from = static_cast<const TestMessageWithCustomOptions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestMessageWithCustomOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_field_.MergeFrom(from._impl_.map_field_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_field1(from._internal_field1());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_AnOneof();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofField: {
        _this->_impl_.AnOneof_.oneof_field_ = from._impl_.AnOneof_.oneof_field_;
        break;
      }
      case ANONEOF_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}